

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_int> *pGVar8;
  GetterXsYRef<unsigned_int> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int iVar17;
  ImDrawIdx IVar18;
  ImPlotContext *gp;
  long lVar19;
  float fVar20;
  float fVar22;
  undefined1 auVar21 [16];
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar17 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar17 + iVar17) % iVar17) * (long)pGVar8->Stride;
  iVar17 = this->Transformer->YAxis;
  iVar5 = pGVar9->Count;
  auVar21._4_4_ = 0;
  auVar21._0_4_ = *(uint *)((long)pGVar8->Ys + lVar19);
  IVar1 = GImPlot->PixelRange[iVar17].Min;
  dVar25 = (double)IVar1.x;
  dVar26 = (double)IVar1.y;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar17].Range.Min;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar4 = GImPlot->Mx;
  auVar21._8_4_ = *(uint *)((long)pGVar8->Xs + lVar19);
  auVar21._12_4_ = 0;
  fVar20 = (float)(((SUB168(auVar21 | _DAT_0036a320,0) - (double)DAT_0036a320) - dVar2) *
                   GImPlot->My[iVar17] + dVar26);
  fVar22 = (float)(((SUB168(auVar21 | _DAT_0036a320,8) - DAT_0036a320._8_8_) - dVar3) * dVar4 +
                  dVar25);
  fVar23 = (float)((pGVar9->YRef - dVar2) * GImPlot->My[iVar17] + dVar26);
  fVar24 = (float)(((double)*(uint *)((long)pGVar9->Xs +
                                     (long)(((prim + pGVar9->Offset) % iVar5 + iVar5) % iVar5) *
                                     (long)pGVar9->Stride) - dVar3) * dVar4 + dVar25);
  uVar27 = CONCAT44(-(uint)(fVar24 <= fVar22),-(uint)(fVar23 <= fVar20));
  auVar14._4_8_ = dVar4;
  auVar14._0_4_ = fVar22;
  auVar30._0_8_ = auVar14._0_8_ << 0x20;
  auVar30._8_4_ = fVar20;
  auVar30._12_4_ = fVar22;
  auVar15._4_8_ = auVar30._8_8_;
  auVar15._0_4_ = -(uint)(fVar22 < fVar24);
  auVar31._0_8_ = auVar15._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(fVar20 < fVar23);
  auVar31._12_4_ = -(uint)(fVar22 < fVar24);
  uVar13 = CONCAT44(fVar22,fVar20) & auVar31._8_8_;
  auVar32._0_8_ = ~uVar27 & CONCAT44(fVar24,fVar23);
  auVar32._8_8_ = ~auVar31._8_8_ & CONCAT44(fVar24,fVar23);
  auVar12._8_4_ = (int)uVar13;
  auVar12._0_8_ = CONCAT44(fVar22,fVar20) & uVar27;
  auVar12._12_4_ = (int)(uVar13 >> 0x20);
  auVar32 = auVar32 | auVar12;
  fVar35 = (cull_rect->Min).x;
  auVar34._4_4_ = -(uint)(fVar35 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).y < auVar32._0_4_);
  auVar16._4_8_ = auVar32._8_8_;
  auVar16._0_4_ = -(uint)(auVar32._4_4_ < fVar35);
  auVar33._0_8_ = auVar16._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).y);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).x);
  auVar34._8_8_ = auVar33._8_8_;
  iVar17 = movmskps(iVar17 * 0x80,auVar34);
  if (iVar17 == 0xf) {
    IVar6 = this->Col;
    IVar1 = *uv;
    fVar28 = fVar23 - fVar20;
    fVar35 = fVar24 - fVar22;
    fVar29 = fVar35 * fVar35 + fVar28 * fVar28;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar35 = fVar35 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar35 = fVar29 * fVar35;
    fVar29 = fVar29 * fVar28;
    (pIVar10->pos).x = fVar29 + fVar22;
    (pIVar10->pos).y = fVar20 - fVar35;
    (pIVar10->uv).x = IVar1.x;
    (pIVar10->uv).y = IVar1.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar29 + fVar24;
    pIVar10[1].pos.y = fVar23 - fVar35;
    pIVar10[1].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar24 - fVar29;
    pIVar10[2].pos.y = fVar35 + fVar23;
    pIVar10[2].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar22 - fVar29;
    pIVar10[3].pos.y = fVar35 + fVar20;
    pIVar10[3].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar7;
    *pIVar11 = IVar18;
    pIVar11[1] = IVar18 + 1;
    pIVar11[2] = IVar18 + 2;
    pIVar11[3] = IVar18;
    pIVar11[4] = IVar18 + 2;
    pIVar11[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }